

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O2

aom_codec_err_t ctrl_set_fp_mt(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  AV1_PRIMARY *ppi;
  aom_codec_err_t aVar1;
  uint uVar2;
  aom_codec_err_t aVar3;
  uint *puVar4;
  long lVar5;
  av1_extracfg extra_cfg;
  
  memcpy(&extra_cfg,&ctx->extra_cfg,600);
  uVar2 = args->gp_offset;
  if ((ulong)uVar2 < 0x29) {
    puVar4 = (uint *)((ulong)uVar2 + (long)args->reg_save_area);
    args->gp_offset = uVar2 + 8;
  }
  else {
    puVar4 = (uint *)args->overflow_arg_area;
    args->overflow_arg_area = puVar4 + 2;
  }
  extra_cfg.fp_mt = *puVar4;
  aVar1 = update_extra_cfg(ctx,&extra_cfg);
  ppi = ctx->ppi;
  if (ppi->num_fp_contexts == 1) {
    uVar2 = av1_compute_num_fp_contexts(ppi,&ppi->parallel_cpi[0]->oxcf);
    if (1 < (int)uVar2) {
      for (lVar5 = 8; (ulong)uVar2 << 3 != lVar5; lVar5 = lVar5 + 8) {
        aVar3 = av1_create_context_and_bufferpool
                          (ctx->ppi,(AV1_COMP **)((long)ctx->ppi->parallel_cpi + lVar5),
                           &ctx->buffer_pool,&ctx->oxcf,'\0',-1);
        if (aVar3 != AOM_CODEC_OK) {
          return aVar3;
        }
        *(FIRSTPASS_STATS **)(*(long *)((long)ctx->ppi->parallel_cpi + lVar5) + 0x9d618) =
             ((ctx->ppi->twopass).stats_buf_ctx)->stats_in_start;
      }
    }
  }
  else {
    uVar2 = 1;
  }
  ctx->ppi->num_fp_contexts = uVar2;
  return aVar1;
}

Assistant:

static aom_codec_err_t ctrl_set_fp_mt(aom_codec_alg_priv_t *ctx, va_list args) {
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  extra_cfg.fp_mt = CAST(AV1E_SET_FP_MT, args);
  const aom_codec_err_t result = update_extra_cfg(ctx, &extra_cfg);
  int num_fp_contexts = 1;
  if (ctx->ppi->num_fp_contexts == 1) {
    num_fp_contexts =
        av1_compute_num_fp_contexts(ctx->ppi, &ctx->ppi->parallel_cpi[0]->oxcf);
    if (num_fp_contexts > 1) {
      int i;
      for (i = 1; i < num_fp_contexts; i++) {
        int res = av1_create_context_and_bufferpool(
            ctx->ppi, &ctx->ppi->parallel_cpi[i], &ctx->buffer_pool, &ctx->oxcf,
            ENCODE_STAGE, -1);
        if (res != AOM_CODEC_OK) {
          return res;
        }
#if !CONFIG_REALTIME_ONLY
        ctx->ppi->parallel_cpi[i]->twopass_frame.stats_in =
            ctx->ppi->twopass.stats_buf_ctx->stats_in_start;
#endif
      }
    }
  }
  ctx->ppi->num_fp_contexts = num_fp_contexts;
  return result;
}